

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall
SmallArray<InstructionVMEvalContext::StackFrame_*,_32U>::~SmallArray
          (SmallArray<InstructionVMEvalContext::StackFrame_*,_32U> *this)

{
  StackFrame **ppSVar1;
  
  ppSVar1 = this->data;
  if (ppSVar1 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (ppSVar1 != (StackFrame **)0x0) {
        (*(code *)NULLC::dealloc)(ppSVar1);
      }
    }
    else if (ppSVar1 != (StackFrame **)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  return;
}

Assistant:

~SmallArray()
	{
		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}
	}